

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

bool __thiscall
slang::ast::Expression::bindMembershipExpressions
          (Expression *this,ASTContext *context,TokenKind keyword,bool requireIntegral,
          bool unwrapUnpacked,bool allowTypeReferences,bool allowOpenRange,
          ExpressionSyntax *valueExpr,
          span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions,
          SmallVectorBase<const_slang::ast::Expression_*> *results)

{
  SourceRange sourceRange;
  SmallVectorBase<const_slang::ast::Expression_*> *index_00;
  ASTContext *pAVar1;
  bool bVar2;
  bool bVar3;
  Compilation *compilation;
  Diagnostic *pDVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  Type *pTVar7;
  reference ppEVar8;
  undefined7 in_stack_00000009;
  SourceLocation local_148;
  Expression *local_140;
  Expression *expr_1;
  Expression *result;
  iterator __end2_1;
  iterator __begin2_1;
  SmallVectorBase<const_slang::ast::Expression_*> *__range2_1;
  size_t index;
  SourceLocation local_100;
  SourceLocation local_f8;
  undefined4 local_ec;
  Type *local_e8;
  Type *bt;
  OpenRangeExpression *range;
  Expression *local_d0;
  Expression *bound;
  ExpressionSyntax *expr;
  iterator __end2;
  iterator __begin2;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> *__range2;
  anon_class_48_6_7cdd41da checkType;
  undefined1 local_52 [8];
  bool canBeStrings;
  bool bad;
  Type *type;
  bitmask<slang::ast::ASTFlags> local_40;
  Type *local_38;
  Expression *valueRes;
  Compilation *comp;
  ASTFlags extraFlags;
  bool allowOpenRange_local;
  bool allowTypeReferences_local;
  bool unwrapUnpacked_local;
  bool requireIntegral_local;
  ASTContext *pAStack_18;
  TokenKind keyword_local;
  ASTContext *context_local;
  
  extraFlags._6_2_ = SUB82(context,0);
  extraFlags._5_1_ = (char)keyword & 1;
  comp = (Compilation *)0x0;
  if (unwrapUnpacked) {
    comp = (Compilation *)0x20000;
  }
  extraFlags._2_1_ = allowTypeReferences;
  extraFlags._3_1_ = unwrapUnpacked;
  extraFlags._4_1_ = requireIntegral;
  pAStack_18 = (ASTContext *)this;
  compilation = ASTContext::getCompilation((ASTContext *)this);
  pAVar1 = pAStack_18;
  valueRes = (Expression *)compilation;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_40,(ASTFlags)comp);
  type = (Type *)create(compilation,(ExpressionSyntax *)CONCAT71(in_stack_00000009,allowOpenRange),
                        pAVar1,local_40,(Type *)0x0);
  local_38 = type;
  SmallVectorBase<const_slang::ast::Expression_*>::push_back
            ((SmallVectorBase<const_slang::ast::Expression_*> *)expressions.size_,
             (Expression **)&type);
  register0x00000000 = not_null::operator_cast_to_Type_((not_null *)&(local_38->super_Symbol).name);
  local_52[1] = Expression::bad((Expression *)local_38);
  local_52[0] = isImplicitString((Expression *)local_38);
  if (((((extraFlags._5_1_ & 1) == None >> 0x28) &&
       (bVar2 = Type::isAggregate(stack0xffffffffffffffb0), bVar2)) ||
      (((extraFlags._5_1_ & 1) != None >> 0x28 &&
       (bVar2 = Type::isIntegral(stack0xffffffffffffffb0), !bVar2)))) && ((local_52[1] & 1) == 0)) {
    sourceRange.startLoc = (SourceLocation)(local_38->super_Symbol).parentScope;
    sourceRange.endLoc = (SourceLocation)(local_38->super_Symbol).nextInScope;
    pDVar4 = ASTContext::addDiag(pAStack_18,(DiagCode)0x260007,sourceRange);
    pDVar4 = ast::operator<<(pDVar4,stack0xffffffffffffffb0);
    join_0x00000010_0x00000000_ = parsing::LexerFacts::getTokenKindText(extraFlags._6_2_);
    Diagnostic::operator<<(pDVar4,join_0x00000010_0x00000000_);
    local_52[1] = 1;
  }
  __range2 = (span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> *)
             (local_52 + 2);
  checkType.type = (Type **)valueRes;
  checkType.comp = (Compilation *)local_52;
  checkType.canBeStrings = (bool *)pAStack_18;
  checkType.context = (ASTContext *)((long)&extraFlags + 6);
  checkType.keyword = (TokenKind *)(local_52 + 1);
  __begin2 = (iterator)&valueExpr;
  __end2 = nonstd::span_lite::
           span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>::begin
                     ((span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> *)
                      &valueExpr);
  expr = (ExpressionSyntax *)
         nonstd::span_lite::
         span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>::end
                   ((span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> *)
                    __begin2);
  for (; pAVar1 = pAStack_18, pEVar5 = valueRes, (ExpressionSyntax *)__end2 != expr;
      __end2 = __end2 + 1) {
    pEVar6 = (Expression *)*__end2;
    bound = pEVar6;
    bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&range,(ASTFlags)comp);
    local_d0 = create((Compilation *)pEVar5,(ExpressionSyntax *)pEVar6,pAVar1,
                      (bitmask<slang::ast::ASTFlags>)range,(Type *)0x0);
    SmallVectorBase<const_slang::ast::Expression_*>::push_back
              ((SmallVectorBase<const_slang::ast::Expression_*> *)expressions.size_,&local_d0);
    bVar3 = Expression::bad(local_d0);
    bVar2 = (local_52[1] & 1) != 0;
    local_52[1] = bVar2 || bVar3;
    if (!bVar2 && !bVar3) {
      if (((extraFlags._2_1_ & EventExpression >> 0x10) == None >> 0x10) ||
         (local_d0->kind != OpenRange)) {
        local_e8 = not_null::operator_cast_to_Type_((not_null *)&local_d0->type);
        if ((extraFlags._5_1_ & 1) == None >> 0x28) {
          if ((extraFlags._4_1_ & ProceduralForceRelease >> 0x20) != None >> 0x20) {
            while (bVar2 = Type::isUnpackedArray(local_e8), bVar2) {
              local_e8 = Type::getArrayElementType(local_e8);
            }
          }
          if ((((local_52[0] & 1) != 0) && (bVar2 = isImplicitString(local_d0), !bVar2)) &&
             (bVar2 = Type::isString(local_e8), !bVar2)) {
            local_52[0] = 0;
          }
          bindMembershipExpressions::anon_class_48_6_7cdd41da::operator()
                    ((anon_class_48_6_7cdd41da *)&__range2,local_d0,local_e8);
        }
        else {
          bVar2 = Type::isIntegral(local_e8);
          if (bVar2) {
            register0x00000000 =
                 binaryOperatorType((Compilation *)valueRes,stack0xffffffffffffffb0,local_e8,false,
                                    false);
          }
          else {
            local_ec = 0x260007;
            local_100 = (local_d0->sourceRange).startLoc;
            local_f8 = (local_d0->sourceRange).endLoc;
            pDVar4 = ASTContext::addDiag(pAStack_18,(DiagCode)0x260007,local_d0->sourceRange);
            pDVar4 = ast::operator<<(pDVar4,local_e8);
            _index = parsing::LexerFacts::getTokenKindText(extraFlags._6_2_);
            Diagnostic::operator<<(pDVar4,_index);
            local_52[1] = 1;
          }
        }
      }
      else {
        if (((local_52[0] & 1) != 0) && (bVar2 = isImplicitString(local_d0), !bVar2)) {
          local_52[0] = 0;
        }
        bt = (Type *)as<slang::ast::OpenRangeExpression>(local_d0);
        pEVar5 = OpenRangeExpression::left((OpenRangeExpression *)bt);
        pEVar6 = OpenRangeExpression::left((OpenRangeExpression *)bt);
        pTVar7 = not_null<const_slang::ast::Type_*>::operator*(&pEVar6->type);
        bindMembershipExpressions::anon_class_48_6_7cdd41da::operator()
                  ((anon_class_48_6_7cdd41da *)&__range2,pEVar5,pTVar7);
        pEVar5 = OpenRangeExpression::right((OpenRangeExpression *)bt);
        pEVar6 = OpenRangeExpression::right((OpenRangeExpression *)bt);
        pTVar7 = not_null<const_slang::ast::Type_*>::operator*(&pEVar6->type);
        bindMembershipExpressions::anon_class_48_6_7cdd41da::operator()
                  ((anon_class_48_6_7cdd41da *)&__range2,pEVar5,pTVar7);
      }
    }
  }
  if ((local_52[1] & 1) == 0) {
    __range2_1 = (SmallVectorBase<const_slang::ast::Expression_*> *)0x0;
    __begin2_1 = (iterator)expressions.size_;
    __end2_1 = SmallVectorBase<const_slang::ast::Expression_*>::begin
                         ((SmallVectorBase<const_slang::ast::Expression_*> *)expressions.size_);
    result = (Expression *)
             SmallVectorBase<const_slang::ast::Expression_*>::end
                       ((SmallVectorBase<const_slang::ast::Expression_*> *)__begin2_1);
    for (; (Expression *)__end2_1 != result; __end2_1 = __end2_1 + 1) {
      local_140 = *__end2_1;
      expr_1 = local_140;
      bVar2 = Type::isNumeric(stack0xffffffffffffffb0);
      if ((bVar2) || (bVar2 = Type::isString(stack0xffffffffffffffb0), bVar2)) {
        pTVar7 = not_null<const_slang::ast::Type_*>::operator->(&local_140->type);
        bVar2 = Type::isUnpackedArray(pTVar7);
        pAVar1 = pAStack_18;
        pTVar7 = stack0xffffffffffffffb0;
        if (bVar2) goto LAB_006844d8;
        SourceLocation::SourceLocation(&local_148);
        contextDetermined(pAVar1,&local_140,pTVar7,local_148);
      }
      else {
LAB_006844d8:
        selfDetermined(pAStack_18,&local_140);
      }
      bVar2 = Expression::bad(local_140);
      index_00 = __range2_1;
      pEVar5 = local_140;
      if (bVar2) {
        return false;
      }
      __range2_1 = (SmallVectorBase<const_slang::ast::Expression_*> *)((long)&__range2_1->data_ + 1)
      ;
      ppEVar8 = SmallVectorBase<const_slang::ast::Expression_*>::operator[]
                          ((SmallVectorBase<const_slang::ast::Expression_*> *)expressions.size_,
                           (size_type)index_00);
      *ppEVar8 = pEVar5;
    }
    context_local._7_1_ = true;
  }
  else {
    context_local._7_1_ = false;
  }
  return context_local._7_1_;
}

Assistant:

bool Expression::bindMembershipExpressions(const ASTContext& context, TokenKind keyword,
                                           bool requireIntegral, bool unwrapUnpacked,
                                           bool allowTypeReferences, bool allowOpenRange,
                                           const ExpressionSyntax& valueExpr,
                                           span<const ExpressionSyntax* const> expressions,
                                           SmallVectorBase<const Expression*>& results) {
    auto extraFlags = allowTypeReferences ? ASTFlags::AllowTypeReferences : ASTFlags::None;
    Compilation& comp = context.getCompilation();
    Expression& valueRes = create(comp, valueExpr, context, extraFlags);
    results.push_back(&valueRes);

    const Type* type = valueRes.type;
    bool bad = valueRes.bad();
    bool canBeStrings = valueRes.isImplicitString();

    if ((!requireIntegral && type->isAggregate()) || (requireIntegral && !type->isIntegral())) {
        if (!bad) {
            context.addDiag(diag::BadSetMembershipType, valueRes.sourceRange)
                << *type << LexerFacts::getTokenKindText(keyword);
            bad = true;
        }
    }

    auto checkType = [&](const Expression& expr, const Type& bt) {
        if (bt.isNumeric() && type->isNumeric()) {
            type = binaryOperatorType(comp, type, &bt, false);
        }
        else if ((bt.isClass() && bt.isAssignmentCompatible(*type)) ||
                 (type->isClass() && type->isAssignmentCompatible(bt))) {
            // ok
        }
        else if ((bt.isCHandle() || bt.isNull()) && (type->isCHandle() || type->isNull())) {
            // ok
        }
        else if ((bt.isEvent() || bt.isNull()) && (type->isEvent() || type->isNull())) {
            // ok
        }
        else if ((bt.isCovergroup() || bt.isNull()) && (type->isCovergroup() || type->isNull())) {
            // ok
        }
        else if (bt.isTypeRefType() && type->isTypeRefType()) {
            // ok
        }
        else if (canBeStrings) {
            // If canBeStrings is still true, it means either this specific type or
            // the common type (or both) are of type string. This is ok, but force
            // all further expressions to also be strings (or implicitly
            // convertible to them).
            type = &comp.getStringType();
        }
        else if (bt.isAggregate()) {
            // Aggregates are just never allowed in membership expressions.
            context.addDiag(diag::BadSetMembershipType, expr.sourceRange)
                << bt << LexerFacts::getTokenKindText(keyword);
            bad = true;
        }
        else {
            // Couldn't find a common type.
            context.addDiag(diag::NoCommonComparisonType, expr.sourceRange)
                << LexerFacts::getTokenKindText(keyword) << bt << *type;
            bad = true;
        }
    };

    // We need to find a common type across all expressions. If this is for a wildcard
    // case statement, the types can only be integral. Otherwise all singular types are allowed.
    for (auto expr : expressions) {
        Expression* bound = &create(comp, *expr, context, extraFlags);
        results.push_back(bound);
        bad |= bound->bad();
        if (bad)
            continue;

        // Special handling for open range expressions -- they don't have
        // a real type on their own, we need to check their bounds.
        if (allowOpenRange && bound->kind == ExpressionKind::OpenRange) {
            if (canBeStrings && !bound->isImplicitString())
                canBeStrings = false;

            auto& range = bound->as<OpenRangeExpression>();
            checkType(range.left(), *range.left().type);
            checkType(range.right(), *range.right().type);
            continue;
        }

        const Type* bt = bound->type;
        if (requireIntegral) {
            if (!bt->isIntegral()) {
                context.addDiag(diag::BadSetMembershipType, bound->sourceRange)
                    << *bt << LexerFacts::getTokenKindText(keyword);
                bad = true;
            }
            else {
                type = binaryOperatorType(comp, type, bt, false);
            }
            continue;
        }

        // If this is an "inside" operation, then unpacked arrays are unwrapped
        // into their element types before checking further.
        if (unwrapUnpacked) {
            while (bt->isUnpackedArray())
                bt = bt->getArrayElementType();
        }

        if (canBeStrings && !bound->isImplicitString() && !bt->isString())
            canBeStrings = false;

        checkType(*bound, *bt);
    }

    if (bad)
        return false;

    size_t index = 0;
    for (auto result : results) {
        // const_casts here are because we want the result array to be constant and
        // don't want to waste time / space allocating another array here locally just
        // to immediately copy it to the output.
        Expression* expr = const_cast<Expression*>(result);

        if ((type->isNumeric() || type->isString()) && !expr->type->isUnpackedArray())
            contextDetermined(context, expr, *type);
        else
            selfDetermined(context, expr);

        if (expr->bad())
            return false;

        results[index++] = expr;
    }

    return true;
}